

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O3

GLfloat circleCenter(DelaunayTriangulation *delTri,GLsizei i_a,GLsizei i_b,GLsizei i_c,
                    GLfloat *center)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  GLfloat (*paGVar5) [2];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  paGVar5 = delTri->points;
  fVar6 = paGVar5[i_a][0];
  fVar1 = paGVar5[i_a][1];
  fVar7 = fVar6 * fVar6 + fVar1 * fVar1;
  fVar8 = paGVar5[i_b][0];
  fVar2 = paGVar5[i_b][1];
  fVar3 = paGVar5[i_c][1];
  fVar10 = fVar8 * fVar8 + fVar2 * fVar2;
  fVar4 = paGVar5[i_c][0];
  fVar9 = fVar4 * fVar4 + fVar3 * fVar3;
  fVar8 = fVar4 * (fVar1 - fVar2) + fVar6 * (fVar2 - fVar3) + fVar8 * (fVar3 - fVar1);
  fVar8 = fVar8 + fVar8;
  fVar6 = ((fVar1 - fVar2) * fVar9 + (fVar2 - fVar3) * fVar7 + (fVar3 - fVar1) * fVar10) / fVar8;
  *center = fVar6;
  fVar8 = ((paGVar5[i_b][0] - paGVar5[i_a][0]) * fVar9 +
          (paGVar5[i_c][0] - paGVar5[i_b][0]) * fVar7 + (paGVar5[i_a][0] - paGVar5[i_c][0]) * fVar10
          ) / fVar8;
  center[1] = fVar8;
  fVar6 = paGVar5[i_a][0] - fVar6;
  fVar8 = paGVar5[i_a][1] - fVar8;
  return SQRT(fVar6 * fVar6 + fVar8 * fVar8);
}

Assistant:

GLfloat circleCenter(DelaunayTriangulation *delTri, GLsizei i_a, GLsizei i_b, GLsizei i_c, GLfloat center[2]) {
	// https://www.codewars.com/kata/5705785658b58f387b001ffc
	GLfloat *point, *a, *b, *c;
	a = delTri->points[i_a];
	b = delTri->points[i_b];
	c = delTri->points[i_c];
	GLfloat aa, bb, cc, dy_bc, dy_ca, dy_ab, d;

	aa = a[0] * a[0] + a[1] * a[1];
	bb = b[0] * b[0] + b[1] * b[1];
	cc = c[0] * c[0] + c[1] * c[1];

	dy_bc = b[1] - c[1];
	dy_ca = c[1] - a[1];
	dy_ab = a[1] - b[1];

	d = 2 * (a[0] * dy_bc + b[0] * dy_ca + c[0] * dy_ab);

	center[0] = (aa * dy_bc + bb * dy_ca + cc * dy_ab) / d;
	// WARNING: there is an error is the link, it is Bx - Ax (and not the opposite)
	center[1] = (aa * (c[0] - b[0]) + bb * (a[0] - c[0]) + cc * (b[0] - a[0])) / d;

	GLfloat dx, dy;

	dx = a[0] - center[0];
	dy = a[1] - center[1];

	return sqrt(dx * dx + dy * dy);
}